

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O0

int archive_read_add_callback_data(archive *_a,void *client_data,uint iindex)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  uint local_3c;
  int magic_test;
  uint i;
  void *p;
  archive_read *a;
  uint iindex_local;
  void *client_data_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_add_callback_data");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = -0x1e;
  }
  else if ((uint)_a[2].archive_format < iindex) {
    archive_set_error(_a,0x16,"Invalid index specified.");
    _a_local._4_4_ = -0x1e;
  }
  else {
    uVar2 = _a[2].archive_format + 1;
    _a[2].archive_format = uVar2;
    pvVar3 = realloc(*(void **)&_a[2].compression_code,(ulong)uVar2 * 0x18);
    if (pvVar3 == (void *)0x0) {
      archive_set_error(_a,0xc,"No memory.");
      _a_local._4_4_ = -0x1e;
    }
    else {
      *(void **)&_a[2].compression_code = pvVar3;
      uVar2 = _a[2].archive_format;
      while (local_3c = uVar2 - 1, iindex < local_3c && local_3c != 0) {
        *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)local_3c * 0x18 + 0x10) =
             *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)(uVar2 - 2) * 0x18 + 0x10);
        *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)local_3c * 0x18) =
             0xffffffffffffffff;
        *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)local_3c * 0x18 + 8) =
             0xffffffffffffffff;
        uVar2 = local_3c;
      }
      *(void **)(*(long *)&_a[2].compression_code + (ulong)iindex * 0x18 + 0x10) = client_data;
      *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)iindex * 0x18) = 0xffffffffffffffff;
      *(undefined8 *)(*(long *)&_a[2].compression_code + (ulong)iindex * 0x18 + 8) =
           0xffffffffffffffff;
      _a_local._4_4_ = 0;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_add_callback_data(struct archive *_a, void *client_data,
    unsigned int iindex)
{
	struct archive_read *a = (struct archive_read *)_a;
	void *p;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_add_callback_data");
	if (iindex > a->client.nodes) {
		archive_set_error(&a->archive, EINVAL,
			"Invalid index specified.");
		return ARCHIVE_FATAL;
	}
	p = realloc(a->client.dataset, sizeof(*a->client.dataset)
		* (++(a->client.nodes)));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM,
			"No memory.");
		return ARCHIVE_FATAL;
	}
	a->client.dataset = (struct archive_read_data_node *)p;
	for (i = a->client.nodes - 1; i > iindex && i > 0; i--) {
		a->client.dataset[i].data = a->client.dataset[i-1].data;
		a->client.dataset[i].begin_position = -1;
		a->client.dataset[i].total_size = -1;
	}
	a->client.dataset[iindex].data = client_data;
	a->client.dataset[iindex].begin_position = -1;
	a->client.dataset[iindex].total_size = -1;
	return ARCHIVE_OK;
}